

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtptimeutilities.h
# Opt level: O2

RTPTime jrtplib::RTPTime::CurrentTime(void)

{
  RTPTime RVar1;
  timespec tpMono;
  timespec tpMono_1;
  
  if (CurrentTime::s_initialized) {
    clock_gettime(1,(timespec *)&tpMono);
    RVar1.m_t = (double)tpMono.tv_nsec * 1e-09 + (double)tpMono.tv_sec + CurrentTime::s_startOffet;
  }
  else {
    CurrentTime::s_initialized = true;
    clock_gettime(0,(timespec *)&tpMono);
    clock_gettime(1,(timespec *)&tpMono_1);
    RVar1.m_t = (double)tpMono.tv_nsec * 1e-09 + (double)tpMono.tv_sec;
    CurrentTime::s_startOffet =
         RVar1.m_t - ((double)tpMono_1.tv_nsec * 1e-09 + (double)tpMono_1.tv_sec);
  }
  return (RTPTime)RVar1.m_t;
}

Assistant:

inline RTPTime RTPTime::CurrentTime()
{
	static bool s_initialized = false;
	static double s_startOffet = 0;

	if (!s_initialized)
	{
		s_initialized = true;

		// Get the corresponding times in system time and monotonic time
		struct timespec tpSys, tpMono;

		clock_gettime(CLOCK_REALTIME, &tpSys);
		clock_gettime(CLOCK_MONOTONIC, &tpMono);

		double tSys = RTPTime_timespecToDouble(tpSys);
		double tMono = RTPTime_timespecToDouble(tpMono);

		s_startOffet = tSys - tMono;
		return tSys;
	}

	struct timespec tpMono;
	clock_gettime(CLOCK_MONOTONIC, &tpMono);

	double tMono0 = RTPTime_timespecToDouble(tpMono);
	return tMono0 + s_startOffet;
}